

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_popup_end(nk_context *ctx)

{
  byte *pbVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  nk_window *pnVar4;
  nk_window *pnVar5;
  nk_buffer *pnVar6;
  nk_handle nVar7;
  nk_size nVar8;
  nk_size nVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  undefined4 uVar13;
  float fVar14;
  float fVar15;
  nk_panel *pnVar16;
  undefined1 auVar17 [16];
  nk_rect r;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4266,"void nk_popup_end(struct nk_context *)");
  }
  pnVar4 = ctx->current;
  if (pnVar4 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,16999,"void nk_popup_end(struct nk_context *)");
  }
  if (pnVar4->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,17000,"void nk_popup_end(struct nk_context *)");
  }
  pnVar5 = pnVar4->parent;
  if (pnVar5 != (nk_window *)0x0) {
    if ((pnVar4->flags & 0x2000) != 0) {
      for (pnVar16 = pnVar5->layout; pnVar16 != (nk_panel *)0x0; pnVar16 = pnVar16->parent) {
        pbVar1 = (byte *)((long)&pnVar16->flags + 2);
        *pbVar1 = *pbVar1 | 1;
      }
      (pnVar5->popup).active = 0;
    }
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(&pnVar4->buffer,r);
    nk_end(ctx);
    pnVar6 = (pnVar4->buffer).base;
    fVar14 = (pnVar4->buffer).clip.x;
    fVar15 = (pnVar4->buffer).clip.y;
    fVar10 = (pnVar4->buffer).clip.w;
    fVar11 = (pnVar4->buffer).clip.h;
    iVar12 = (pnVar4->buffer).use_clipping;
    uVar13 = *(undefined4 *)&(pnVar4->buffer).field_0x1c;
    nVar7 = (pnVar4->buffer).userdata;
    nVar8 = (pnVar4->buffer).begin;
    nVar9 = (pnVar4->buffer).last;
    (pnVar5->buffer).end = (pnVar4->buffer).end;
    (pnVar5->buffer).last = nVar9;
    (pnVar5->buffer).userdata = nVar7;
    (pnVar5->buffer).begin = nVar8;
    (pnVar5->buffer).clip.w = fVar10;
    (pnVar5->buffer).clip.h = fVar11;
    (pnVar5->buffer).use_clipping = iVar12;
    *(undefined4 *)&(pnVar5->buffer).field_0x1c = uVar13;
    (pnVar5->buffer).base = pnVar6;
    (pnVar5->buffer).clip.x = fVar14;
    (pnVar5->buffer).clip.y = fVar15;
    uVar2 = (pnVar5->buffer).end;
    uVar3 = (pnVar5->buffer).last;
    auVar17._8_4_ = (int)uVar2;
    auVar17._0_8_ = uVar3;
    auVar17._12_4_ = (int)((ulong)uVar2 >> 0x20);
    (pnVar5->popup).buf.last = uVar3;
    (pnVar5->popup).buf.end = auVar17._8_8_;
    ctx->current = pnVar5;
    nk_push_scissor(&pnVar5->buffer,pnVar5->layout->clip);
    return;
  }
  return;
}

Assistant:

NK_API void
nk_popup_end(struct nk_context *ctx)
{
    struct nk_window *win;
    struct nk_window *popup;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    popup = ctx->current;
    if (!popup->parent) return;
    win = popup->parent;
    if (popup->flags & NK_WINDOW_HIDDEN) {
        struct nk_panel *root;
        root = win->layout;
        while (root) {
            root->flags |= NK_WINDOW_REMOVE_ROM;
            root = root->parent;
        }
        win->popup.active = 0;
    }
    nk_push_scissor(&popup->buffer, nk_null_rect);
    nk_end(ctx);

    win->buffer = popup->buffer;
    nk_finish_popup(ctx, win);
    ctx->current = win;
    nk_push_scissor(&win->buffer, win->layout->clip);
}